

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RigidBodyVisitor.cpp
# Opt level: O2

string * __thiscall
OpenMD::LipidHeadVisitor::toString_abi_cxx11_(string *__return_storage_ptr__,LipidHeadVisitor *this)

{
  _Base_ptr p_Var1;
  char buffer [65535];
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  memcpy(buffer,"------------------------------------------------------------------\n",0x44);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  snprintf(buffer,0xffff,"Visitor name: %s\n",
           (this->super_BaseRigidBodyVisitor).super_BaseVisitor.visitorName._M_dataplus._M_p);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  builtin_strncpy(buffer + 0x20,"w types:\n",10);
  builtin_strncpy(buffer + 0x10,"st contains belo",0x10);
  builtin_strncpy(buffer,"lipidHeadName li",0x10);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  for (p_Var1 = (this->lipidHeadName)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 != &(this->lipidHeadName)._M_t._M_impl.super__Rb_tree_header;
      p_Var1 = (_Base_ptr)std::_Rb_tree_increment(p_Var1)) {
    snprintf(buffer,0xffff,"%s\t",*(undefined8 *)(p_Var1 + 1));
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  buffer[0] = '\n';
  buffer[1] = '\0';
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  memcpy(buffer,"------------------------------------------------------------------\n",0x44);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

const std::string LipidHeadVisitor::toString() {
    char buffer[65535];
    std::string result;
    std::set<std::string>::iterator i;

    snprintf(
        buffer, 65535,
        "------------------------------------------------------------------\n");
    result += buffer;

    snprintf(buffer, 65535, "Visitor name: %s\n", visitorName.c_str());
    result += buffer;

    // print the ignore type list
    snprintf(buffer, 65535, "lipidHeadName list contains below types:\n");
    result += buffer;

    for (i = lipidHeadName.begin(); i != lipidHeadName.end(); ++i) {
      snprintf(buffer, 65535, "%s\t", i->c_str());
      result += buffer;
    }

    snprintf(buffer, 65535, "\n");
    result += buffer;

    snprintf(
        buffer, 65535,
        "------------------------------------------------------------------\n");
    result += buffer;

    return result;
  }